

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_comm_create_keyval_
               (MPIABI_Fint *comm_copy_attr_fn,MPIABI_Fint *comm_delete_attr_fn,int *comm_keyval,
               void *extra_state,MPIABI_Fint *ierror)

{
  mpi_comm_create_keyval_();
  return;
}

Assistant:

void mpiabi_comm_create_keyval_(
  MPIABI_Fint * comm_copy_attr_fn,
  MPIABI_Fint * comm_delete_attr_fn,
  int * comm_keyval,
  void * extra_state,
  MPIABI_Fint * ierror
) {
  return mpi_comm_create_keyval_(
    comm_copy_attr_fn,
    comm_delete_attr_fn,
    comm_keyval,
    extra_state,
    ierror
  );
}